

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalStartReaders(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  uint uVar1;
  Fts3Phrase *p;
  int iVar2;
  ulong uVar3;
  Fts3DeferredToken **ppFVar4;
  bool bVar5;
  
  if ((pExpr != (Fts3Expr *)0x0) && (*pRc == 0)) {
    if (pExpr->eType == 5) {
      p = pExpr->pPhrase;
      uVar1 = p->nToken;
      if ((ulong)uVar1 != 0) {
        if ((int)uVar1 < 1) {
          uVar3 = 0;
        }
        else {
          ppFVar4 = &p->aToken[0].pDeferred;
          uVar3 = 0;
          do {
            if (*ppFVar4 == (Fts3DeferredToken *)0x0) goto LAB_001caea5;
            uVar3 = uVar3 + 1;
            ppFVar4 = ppFVar4 + 5;
          } while (uVar1 != uVar3);
          uVar3 = (ulong)uVar1;
        }
LAB_001caea5:
        pExpr->bDeferred = (uint)uVar3 == uVar1;
      }
      iVar2 = fts3EvalPhraseStart(pCsr,1,p);
      *pRc = iVar2;
    }
    else {
      fts3EvalStartReaders(pCsr,pExpr->pLeft,pRc);
      fts3EvalStartReaders(pCsr,pExpr->pRight,pRc);
      if (pExpr->pLeft->bDeferred == '\0') {
        bVar5 = false;
      }
      else {
        bVar5 = pExpr->pRight->bDeferred != '\0';
      }
      pExpr->bDeferred = bVar5;
    }
  }
  return;
}

Assistant:

static void fts3EvalStartReaders(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expression to initialize phrases in */
  int *pRc                        /* IN/OUT: Error code */
){
  if( pExpr && SQLITE_OK==*pRc ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      int nToken = pExpr->pPhrase->nToken;
      if( nToken ){
        int i;
        for(i=0; i<nToken; i++){
          if( pExpr->pPhrase->aToken[i].pDeferred==0 ) break;
        }
        pExpr->bDeferred = (i==nToken);
      }
      *pRc = fts3EvalPhraseStart(pCsr, 1, pExpr->pPhrase);
    }else{
      fts3EvalStartReaders(pCsr, pExpr->pLeft, pRc);
      fts3EvalStartReaders(pCsr, pExpr->pRight, pRc);
      pExpr->bDeferred = (pExpr->pLeft->bDeferred && pExpr->pRight->bDeferred);
    }
  }
}